

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

shared_ptr<arangodb::velocypack::Builder> __thiscall
arangodb::velocypack::Parser::steal(Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  shared_ptr<arangodb::velocypack::Builder> sVar1;
  
  std::__shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2> *)this,in_RSI)
  ;
  std::__shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>::reset(in_RSI);
  in_RSI[1]._M_ptr = (element_type *)0x0;
  sVar1.super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<arangodb::velocypack::Builder>)
         sVar1.super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Builder> steal() {
    // Parser object is broken after a steal()
    std::shared_ptr<Builder> res(_builder);
    _builder.reset();
    _builderPtr = nullptr;
    return res;
  }